

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O0

DistanceType __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::computeInitialDistances
          (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
           *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                 *obj,ElementType *vec,distance_vector_t *dists)

{
  double dVar1;
  const_reference pvVar2;
  reference pvVar3;
  DistanceType DVar4;
  int local_34;
  double dStack_30;
  int i;
  DistanceType distsq;
  distance_vector_t *dists_local;
  ElementType *vec_local;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  *obj_local;
  KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  *this_local;
  
  if (vec != (ElementType *)0x0) {
    dStack_30 = 0.0;
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      dVar1 = vec[local_34];
      pvVar2 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[](&(obj->
                             super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                             ).root_bbox,(long)local_34);
      if (dVar1 < pvVar2->low) {
        dVar1 = vec[local_34];
        pvVar2 = std::
                 array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>::Interval,_3UL>
                 ::operator[](&(obj->
                               super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                               ).root_bbox,(long)local_34);
        DVar4 = L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>
                ::accum_dist<double,double>
                          ((L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>
                            *)&obj->distance,dVar1,pvVar2->low,(long)local_34);
        pvVar3 = std::array<double,_3UL>::operator[](dists,(long)local_34);
        *pvVar3 = DVar4;
        pvVar3 = std::array<double,_3UL>::operator[](dists,(long)local_34);
        dStack_30 = *pvVar3 + dStack_30;
      }
      dVar1 = vec[local_34];
      pvVar2 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[](&(obj->
                             super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                             ).root_bbox,(long)local_34);
      if (pvVar2->high <= dVar1 && dVar1 != pvVar2->high) {
        dVar1 = vec[local_34];
        pvVar2 = std::
                 array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>::Interval,_3UL>
                 ::operator[](&(obj->
                               super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                               ).root_bbox,(long)local_34);
        DVar4 = L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>
                ::accum_dist<double,double>
                          ((L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>
                            *)&obj->distance,dVar1,pvVar2->high,(long)local_34);
        pvVar3 = std::array<double,_3UL>::operator[](dists,(long)local_34);
        *pvVar3 = DVar4;
        pvVar3 = std::array<double,_3UL>::operator[](dists,(long)local_34);
        dStack_30 = *pvVar3 + dStack_30;
      }
    }
    return dStack_30;
  }
  __assert_fail("vec",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/nanoflann/nanoflann.hpp"
                ,0x3f0,
                "DistanceType nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor>, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor, 3>, nanoflann::L2_Simple_Adaptor<double, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor>, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor, 3>::computeInitialDistances(const Derived &, const ElementType *, distance_vector_t &) const [Derived = nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor>, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor, 3>, Distance = nanoflann::L2_Simple_Adaptor<double, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor>, DatasetAdaptor = anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor, DIM = 3, IndexType = unsigned long]"
               );
}

Assistant:

DistanceType computeInitialDistances(const Derived &obj,
                                       const ElementType *vec,
                                       distance_vector_t &dists) const {
    assert(vec);
    DistanceType distsq = DistanceType();

    for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
      if (vec[i] < obj.root_bbox[i].low) {
        dists[i] = obj.distance.accum_dist(vec[i], obj.root_bbox[i].low, i);
        distsq += dists[i];
      }
      if (vec[i] > obj.root_bbox[i].high) {
        dists[i] = obj.distance.accum_dist(vec[i], obj.root_bbox[i].high, i);
        distsq += dists[i];
      }
    }
    return distsq;
  }